

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::RunContext::reportExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,ITransientExpression *expr,
          bool negated)

{
  undefined8 uVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  size_type sVar5;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  AssertionResultData *in_RDI;
  byte in_R8B;
  AssertionResult assertionResult;
  AssertionResultData data;
  undefined4 in_stack_fffffffffffffeb8;
  AssertionResult *this_00;
  LazyExpression *in_stack_fffffffffffffed0;
  OfType in_stack_fffffffffffffedc;
  AssertionResultData *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  *(undefined4 *)&in_RDI[4].reconstructedExpression.field_2 = *(undefined4 *)(in_RSI + 6);
  uVar1 = *in_RSI;
  sVar2 = in_RSI[1];
  sVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  sVar5 = in_RSI[5];
  *(undefined8 *)&in_RDI[4].reconstructedExpression = in_RSI[4];
  in_RDI[4].reconstructedExpression._M_string_length = sVar5;
  in_RDI[4].message.field_2._M_allocated_capacity = sVar3;
  *(undefined8 *)((long)&in_RDI[4].message.field_2 + 8) = uVar4;
  *(undefined8 *)&in_RDI[4].message = uVar1;
  in_RDI[4].message._M_string_length = sVar2;
  this_00 = (AssertionResult *)&stack0xffffffffffffff70;
  LazyExpression::LazyExpression((LazyExpression *)this_00,(bool)(in_R8B & 1));
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
  AssertionResult::AssertionResult
            (this_00,(AssertionInfo *)CONCAT44(in_EDX,in_stack_fffffffffffffeb8),in_RDI);
  assertionEnded((RunContext *)in_stack_ffffffffffffffc0,
                 (AssertionResult *)in_stack_ffffffffffffffb8);
  AssertionResult::~AssertionResult((AssertionResult *)0x134817);
  AssertionResultData::~AssertionResultData(in_RDI);
  return;
}

Assistant:

void RunContext::reportExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            ITransientExpression const *expr,
            bool negated ) {

        m_lastAssertionInfo = info;
        AssertionResultData data( resultType, LazyExpression( negated ) );

        AssertionResult assertionResult{ info, data };
        assertionResult.m_resultData.lazyExpression.m_transientExpression = expr;

        assertionEnded( assertionResult );
    }